

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_socket.cpp
# Opt level: O2

void __thiscall
libtorrent::aux::udp_socket::udp_socket(udp_socket *this,io_context *ios,listen_socket_handle *ls)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  array<char,_1500UL> *__s;
  
  boost::asio::detail::
  io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::io_object_impl<boost::asio::io_context>
            ((io_object_impl<boost::asio::detail::reactive_socket_service<boost::asio::ip::udp>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
              *)this,ios,(type *)0x0);
  this->m_ioc = ios;
  __s = (array<char,_1500UL> *)operator_new(0x5dc);
  memset(__s,0,0x5dc);
  (this->m_buf)._M_t.
  super___uniq_ptr_impl<std::array<char,_1500UL>,_std::default_delete<std::array<char,_1500UL>_>_>.
  _M_t.
  super__Tuple_impl<0UL,_std::array<char,_1500UL>_*,_std::default_delete<std::array<char,_1500UL>_>_>
  .super__Head_base<0UL,_std::array<char,_1500UL>_*,_false>._M_head_impl = __s;
  p_Var1 = (ls->m_sock).
           super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->m_listen_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  (this->m_listen_socket).m_sock.
  super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var1;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (ls->m_sock).super___weak_ptr<libtorrent::aux::listen_socket_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->m_bind_port = 0;
  proxy_settings::proxy_settings(&this->m_proxy_settings);
  (this->m_socks5_connection).
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_socks5_connection).
  super___shared_ptr<libtorrent::aux::socks5,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this->field_0xf0 = this->field_0xf0 | 1;
  return;
}

Assistant:

udp_socket::udp_socket(io_context& ios, aux::listen_socket_handle ls)
	: m_socket(ios)
	, m_ioc(ios)
	, m_buf(new receive_buffer())
	, m_listen_socket(std::move(ls))
	, m_bind_port(0)
	, m_abort(true)
{}